

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O0

bool __thiscall EnumType::has_case(EnumType *this,string *case_name)

{
  __type _Var1;
  size_type sVar2;
  const_reference __lhs;
  ulong local_28;
  size_t i;
  string *case_name_local;
  EnumType *this_local;
  
  local_28 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>_>_>
            ::size(&this->cases);
    if (sVar2 <= local_28) {
      return false;
    }
    __lhs = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>_>_>
            ::operator[](&this->cases,local_28);
    _Var1 = std::operator==(&__lhs->first,case_name);
    if (_Var1) break;
    local_28 = local_28 + 1;
  }
  return true;
}

Assistant:

bool has_case(const std::string& case_name) const {
		for (std::size_t i = 0; i < cases.size(); ++i) {
			if (cases[i].first == case_name) {
				return true;
			}
		}
		return false;
	}